

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O1

void __thiscall
cppcms::impl::tcp_cache_service::server::on_accept
          (server *this,error_code *e,shared_ptr<cppcms::impl::tcp_cache_service::session> *s)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar1;
  level_type lVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  callback *pcVar7;
  intrusive_ptr<booster::callable<void_()>_> local_98;
  long local_90;
  callable<void_()> local_88;
  binderX<cppcms::impl::tcp_cache_service::session,_std::shared_ptr<cppcms::impl::tcp_cache_service::session>_>
  local_78;
  message local_58 [48];
  
  iVar3 = e->_M_value;
  lVar2 = booster::log::logger::instance();
  if (iVar3 == 0) {
    cVar1 = booster::log::logger::should_be_logged(lVar2,(char *)0x46);
    if (cVar1 != '\0') {
      booster::log::message::message
                (local_58,debug,"cppcms_scale",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/tcp_cache_server.cpp"
                 ,0x135);
      poVar4 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Accepted connection, fd=",0x18);
      iVar3 = booster::aio::basic_io_device::native();
      std::ostream::operator<<(poVar4,iVar3);
      if (cVar1 != '\0') {
        booster::log::message::~message(local_58);
      }
    }
    booster::aio::basic_socket::set_option
              (&((s->
                 super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->socket_,0,1);
    lVar5 = booster::aio::basic_io_device::get_io_service();
    lVar6 = booster::aio::basic_io_device::get_io_service();
    if (lVar5 == lVar6) {
      tcp_cache_service::session::run
                ((s->
                 super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr);
    }
    else {
      pcVar7 = (callback *)booster::aio::basic_io_device::get_io_service();
      local_78.object.
      super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (s->
               super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      this_00 = (s->
                super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_78.member = (offset_in_session_to_subr)tcp_cache_service::session::run;
      local_78._8_8_ = 0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_78.object.
      super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = this_00;
      booster::callback<void()>::
      callback<cppcms::util::details::binderX<cppcms::impl::tcp_cache_service::session,std::shared_ptr<cppcms::impl::tcp_cache_service::session>>>
                ((callback<void()> *)&local_98,&local_78);
      booster::aio::io_service::post(pcVar7);
      booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_98);
      if (local_78.object.
          super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.object.
                   super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    start_accept(this);
  }
  else {
    cVar1 = booster::log::logger::should_be_logged(lVar2,(char *)0x1e);
    if (cVar1 != '\0') {
      booster::log::message::message
                (local_58,error,"cppcms_scale",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/tcp_cache_server.cpp"
                 ,0x140);
      poVar4 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Failed to accept connection:",0x1c)
      ;
      (**(code **)(*(long *)e->_M_cat + 0x20))(&local_98,e->_M_cat,e->_M_value);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_98.p_,local_90);
      if (cVar1 != '\0') {
        if (local_98.p_ != &local_88) {
          operator_delete(local_98.p_);
        }
        booster::log::message::~message(local_58);
      }
    }
  }
  return;
}

Assistant:

void on_accept(booster::system::error_code const &e,booster::shared_ptr<tcp_cache_service::session> s)
	{
		if(!e) {
			BOOSTER_DEBUG("cppcms_scale") << "Accepted connection, fd=" << s->socket_.native();
			s->socket_.set_option(io::stream_socket::tcp_no_delay,true);
			if(&acceptor_.get_io_service()  == &s->socket_.get_io_service()) {
				s->run();
			}
			else {
				s->socket_.get_io_service().post(mem_bind(&session::run,s));
			}
			start_accept();
		}
		else {
			BOOSTER_ERROR("cppcms_scale") << "Failed to accept connection:" << e.message();
		}
	}